

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathfinderDVL.h
# Opt level: O3

int StartPingingPathfinderDVL(PATHFINDERDVL *pPathfinderDVL)

{
  int iVar1;
  ssize_t sVar2;
  uint uVar3;
  ulong uVar4;
  
  iVar1 = (pPathfinderDVL->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pPathfinderDVL->RS232Port).s;
    uVar4 = 0;
    do {
      sVar2 = send(iVar1,"CS\r" + uVar4,(ulong)(3 - (int)uVar4),0);
      if ((int)sVar2 < 1) goto LAB_001b082d;
      uVar3 = (int)uVar4 + (int)sVar2;
      uVar4 = (ulong)uVar3;
    } while ((int)uVar3 < 3);
  }
  else {
    if (iVar1 != 0) {
LAB_001b082d:
      puts("Error writing data to a PathfinderDVL. ");
      return 1;
    }
    iVar1 = *(int *)&(pPathfinderDVL->RS232Port).hDev;
    uVar4 = 0;
    do {
      sVar2 = write(iVar1,"CS\r" + uVar4,(ulong)(3 - (int)uVar4));
      if ((int)sVar2 < 1) goto LAB_001b082d;
      uVar3 = (int)uVar4 + (int)sVar2;
      uVar4 = (ulong)uVar3;
    } while (uVar3 < 3);
  }
  if ((pPathfinderDVL->bSaveRawData != 0) && ((FILE *)pPathfinderDVL->pfSaveFile != (FILE *)0x0)) {
    fwrite("CS\r",3,1,(FILE *)pPathfinderDVL->pfSaveFile);
    fflush((FILE *)pPathfinderDVL->pfSaveFile);
  }
  return 0;
}

Assistant:

inline int StartPingingPathfinderDVL(PATHFINDERDVL* pPathfinderDVL)
{
	char* buf = "CS\r";

	if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)buf, (int)strlen(buf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a PathfinderDVL. \n");
		return EXIT_FAILURE;
	}
	if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
	{
		fwrite(buf, strlen(buf), 1, pPathfinderDVL->pfSaveFile);
		fflush(pPathfinderDVL->pfSaveFile);
	}

	return EXIT_SUCCESS;
}